

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O1

void Cec_GiaSplitPrint(int nIter,int Depth,int nVars,int nConfs,int fStatus,double Prog,abctime clk)

{
  char *pcVar1;
  char *pcVar2;
  int level;
  
  printf("%4d : ",nIter);
  printf("Depth =%3d  ",(ulong)(uint)Depth);
  printf("SatVar =%7d  ",(ulong)(uint)nVars);
  printf("SatConf =%7d   ",(ulong)(uint)nConfs);
  pcVar1 = "UNDECIDED";
  if (fStatus == 1) {
    pcVar1 = "UNSAT    ";
  }
  pcVar2 = "SAT      ";
  if (fStatus != 0) {
    pcVar2 = pcVar1;
  }
  printf("%s   ",pcVar2);
  level = 0xa19d59;
  printf("Solved %8.4f %%   ",Prog * 100.0);
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)clk / 1000000.0);
  fflush(_stdout);
  return;
}

Assistant:

void Cec_GiaSplitPrint( int nIter, int Depth, int nVars, int nConfs, int fStatus, double Prog, abctime clk )
{
    printf( "%4d : ",             nIter );
    printf( "Depth =%3d  ",       Depth );
    printf( "SatVar =%7d  ",      nVars );
    printf( "SatConf =%7d   ",    nConfs );
    printf( "%s   ",              fStatus ? (fStatus == 1 ? "UNSAT    " : "UNDECIDED") : "SAT      " );
    printf( "Solved %8.4f %%   ", 100*Prog );
    Abc_PrintTime( 1, "Time", clk );
    //ABC_PRTr( "Time", Abc_Clock()-clk );
    fflush( stdout );
}